

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManOrigIdsReduce(Gia_Man_t *p,Vec_Int_t *vPairs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Rpr_t *pGVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  
  __ptr = Gia_ManOrigIdsRemapPairs(vPairs,p->nObjs);
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar18 = 0;
    do {
      iVar1 = pVVar11->pArray[lVar18];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fcae5;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) {
LAB_001fcb04:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_001fcb04;
      pGVar5[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar11 = p->vCis;
    } while (lVar18 < pVVar11->nSize);
  }
  Gia_ManHashAlloc(p_00);
  uVar13 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar18 = 8;
    lVar17 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)((long)pGVar5 + lVar18 + -8);
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        if (__ptr->nSize <= lVar17) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = __ptr->pArray[lVar17];
        uVar16 = (ulong)uVar8;
        uVar3 = (uint)(uVar7 >> 0x20);
        if (uVar16 == 0xffffffff) {
          uVar8 = *(uint *)((long)pGVar5 +
                           lVar18 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3);
          if (((int)uVar8 < 0) ||
             (uVar2 = *(uint *)((long)pGVar5 +
                               lVar18 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar2 < 0)) goto LAB_001fcb23;
          uVar8 = Gia_ManHashAnd(p_00,uVar8 ^ (uint)(uVar7 >> 0x1d) & 1,uVar2 ^ uVar3 >> 0x1d & 1);
        }
        else {
          if (((int)uVar8 < 0) || ((int)uVar13 <= (int)uVar8)) goto LAB_001fcae5;
          if ((int)pGVar5[uVar16].Value < 0) goto LAB_001fcb23;
          uVar8 = pGVar5[uVar16].Value ^
                  (uVar3 ^ (uint)((ulong)*(undefined8 *)(pGVar5 + uVar16) >> 0x20)) >> 0x1f;
        }
        *(uint *)(&pGVar5->field_0x0 + lVar18) = uVar8;
      }
      lVar17 = lVar17 + 1;
      uVar13 = (ulong)p->nObjs;
      lVar18 = lVar18 + 0xc;
    } while (lVar17 < (long)uVar13);
  }
  Gia_ManHashStop(p_00);
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar18 = 0;
    do {
      iVar1 = pVVar11->pArray[lVar18];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fcae5;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar1;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0) {
LAB_001fcb23:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                   pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value)
      ;
      pGVar5->Value = uVar8;
      lVar18 = lVar18 + 1;
      pVVar11 = p->vCos;
    } while (lVar18 < pVVar11->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("!p->pReprs && !p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x87,"Gia_Man_t *Gia_ManOrigIdsReduce(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = p->nObjs;
  pGVar14 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar14;
  if (0 < (long)iVar1) {
    lVar18 = 0;
    do {
      p->pReprs[lVar18] = (Gia_Rpr_t)((uint)p->pReprs[lVar18] | 0xfffffff);
      lVar18 = lVar18 + 1;
    } while (lVar18 < p->nObjs);
  }
  Gia_ManFillValue(p_00);
  if (0 < p->nObjs) {
    lVar18 = 2;
    lVar17 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(uint *)((long)pGVar5 + lVar18 * 4 + -8);
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        uVar8 = *(uint *)(&pGVar5->field_0x0 + lVar18 * 4);
        if ((int)uVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar8 < 2) {
          if (lVar17 == 0) {
LAB_001fcb80:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[lVar17] = (Gia_Rpr_t)((uint)p->pReprs[lVar17] & 0xf0000000);
        }
        else {
          uVar8 = uVar8 >> 1;
          if (p_00->nObjs <= (int)uVar8) {
LAB_001fcae5:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar3 = p_00->pObjs[uVar8].Value;
          if ((long)(int)uVar3 == -1) {
            p_00->pObjs[uVar8].Value = (uint)lVar17;
          }
          else {
            if (lVar17 <= (int)uVar3 && uVar3 != 0xfffffff) goto LAB_001fcb80;
            p->pReprs[lVar17] =
                 (Gia_Rpr_t)((uint)p->pReprs[lVar17] & 0xf0000000 | uVar3 & 0xfffffff);
          }
        }
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 3;
    } while (lVar17 < p->nObjs);
  }
  piVar15 = Gia_ManDeriveNexts(p);
  p->pNexts = piVar15;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManOrigIdsReduce( Gia_Man_t * p, Vec_Int_t * vPairs )
{
    Gia_Man_t * pNew = NULL;
    Gia_Obj_t * pObj, * pRepr; int i;
    Vec_Int_t * vMap = Gia_ManOrigIdsRemapPairs( vPairs, Gia_ManObjNum(p) );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pRepr = Gia_ManObj( p, Vec_IntEntry(vMap, i) );
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntFree( vMap );
    // compute equivalences
    assert( !p->pReprs && !p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    Gia_ManFillValue(pNew);
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iRepr = Abc_Lit2Var(pObj->Value);
        if ( iRepr == 0 )
        {
            Gia_ObjSetRepr( p, i, 0 );
            continue;
        }
        pRepr = Gia_ManObj( pNew, iRepr );
        if ( !~pRepr->Value ) // first time
        {
            pRepr->Value = i;
            continue;
        }
        // add equivalence
        Gia_ObjSetRepr( p, i, pRepr->Value );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
    return pNew;
}